

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream.c
# Opt level: O3

ngx_int_t ngx_http_upstream_rewrite_set_cookie
                    (ngx_http_request_t *r,ngx_table_elt_t *h,ngx_uint_t offset)

{
  _func_ngx_int_t_ngx_http_request_t_ptr_ngx_table_elt_t_ptr *p_Var1;
  ngx_log_t *log;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ngx_uint_t nVar10;
  size_t sVar11;
  size_t sVar12;
  ngx_table_elt_t *pnVar13;
  ngx_int_t nVar14;
  
  pnVar13 = (ngx_table_elt_t *)ngx_list_push(&(r->headers_out).headers);
  if (pnVar13 == (ngx_table_elt_t *)0x0) {
    nVar14 = -1;
  }
  else {
    nVar10 = h->hash;
    uVar2 = *(undefined4 *)((long)&h->hash + 4);
    sVar11 = (h->key).len;
    uVar3 = *(undefined4 *)((long)&(h->key).len + 4);
    uVar4 = *(undefined4 *)&(h->key).data;
    uVar5 = *(undefined4 *)((long)&(h->key).data + 4);
    sVar12 = (h->value).len;
    uVar6 = *(undefined4 *)((long)&(h->value).len + 4);
    uVar7 = *(undefined4 *)((long)&(h->value).data + 4);
    uVar8 = *(undefined4 *)&h->lowcase_key;
    uVar9 = *(undefined4 *)((long)&h->lowcase_key + 4);
    *(undefined4 *)&(pnVar13->value).data = *(undefined4 *)&(h->value).data;
    *(undefined4 *)((long)&(pnVar13->value).data + 4) = uVar7;
    *(undefined4 *)&pnVar13->lowcase_key = uVar8;
    *(undefined4 *)((long)&pnVar13->lowcase_key + 4) = uVar9;
    *(undefined4 *)&(pnVar13->key).data = uVar4;
    *(undefined4 *)((long)&(pnVar13->key).data + 4) = uVar5;
    *(int *)&(pnVar13->value).len = (int)sVar12;
    *(undefined4 *)((long)&(pnVar13->value).len + 4) = uVar6;
    *(int *)&pnVar13->hash = (int)nVar10;
    *(undefined4 *)((long)&pnVar13->hash + 4) = uVar2;
    *(int *)&(pnVar13->key).len = (int)sVar11;
    *(undefined4 *)((long)&(pnVar13->key).len + 4) = uVar3;
    p_Var1 = r->upstream->rewrite_cookie;
    if ((p_Var1 != (_func_ngx_int_t_ngx_http_request_t_ptr_ngx_table_elt_t_ptr *)0x0) &&
       (nVar14 = (*p_Var1)(r,pnVar13), nVar14 != -5)) {
      if (nVar14 != 0) {
        return nVar14;
      }
      log = r->connection->log;
      if ((log->log_level & 0x100) == 0) {
        return 0;
      }
      ngx_log_error_core(8,log,0,"rewritten cookie: \"%V\"",&pnVar13->value);
      return 0;
    }
    nVar14 = 0;
  }
  return nVar14;
}

Assistant:

static ngx_int_t
ngx_http_upstream_rewrite_set_cookie(ngx_http_request_t *r, ngx_table_elt_t *h,
    ngx_uint_t offset)
{
    ngx_int_t         rc;
    ngx_table_elt_t  *ho;

    ho = ngx_list_push(&r->headers_out.headers);
    if (ho == NULL) {
        return NGX_ERROR;
    }

    *ho = *h;

    if (r->upstream->rewrite_cookie) {
        rc = r->upstream->rewrite_cookie(r, ho);

        if (rc == NGX_DECLINED) {
            return NGX_OK;
        }

#if (NGX_DEBUG)
        if (rc == NGX_OK) {
            ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                           "rewritten cookie: \"%V\"", &ho->value);
        }
#endif

        return rc;
    }

    return NGX_OK;
}